

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::Diagnostic>::
emplaceRealloc<slang::ast::Symbol_const&,slang::DiagCode&,slang::SourceLocation&>
          (SmallVectorBase<slang::Diagnostic> *this,pointer pos,Symbol *args,DiagCode *args_1,
          SourceLocation *args_2)

{
  undefined8 *puVar1;
  DiagCode DVar2;
  ulong uVar3;
  SourceLocation SVar4;
  Diagnostic *__result;
  pointer __result_00;
  move_iterator<slang::Diagnostic_*> __last;
  move_iterator<slang::Diagnostic_*> __first;
  ulong uVar5;
  long lVar6;
  
  if (this->len == 0x124924924924924) {
    detail::throwLengthError();
  }
  uVar5 = this->len + 1;
  uVar3 = this->cap;
  if (uVar5 < uVar3 * 2) {
    uVar5 = uVar3 * 2;
  }
  if (0x124924924924924 - uVar3 < uVar3) {
    uVar5 = 0x124924924924924;
  }
  lVar6 = (long)pos - (long)this->data_;
  __result = (Diagnostic *)operator_new(uVar5 * 0x70);
  DVar2 = *args_1;
  SVar4 = *args_2;
  *(undefined1 *)((long)__result + lVar6 + 0x50) = 0;
  *(undefined8 *)((long)__result + lVar6) = 0;
  ((undefined8 *)((long)__result + lVar6))[1] = 0;
  puVar1 = (undefined8 *)((long)__result + lVar6 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)__result + lVar6 + 0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)__result + lVar6 + 0x30);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined8 *)((long)__result + lVar6 + 0x40) = 0;
  *(DiagCode *)((long)__result + lVar6 + 0x58) = DVar2;
  *(SourceLocation *)((long)__result + lVar6 + 0x60) = SVar4;
  *(Symbol **)((long)__result + lVar6 + 0x68) = args;
  __first._M_current = this->data_;
  __last._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
              (__first,(move_iterator<slang::Diagnostic_*>)pos,__result);
    __last._M_current = this->data_ + this->len;
    __result_00 = (pointer)((long)__result + lVar6) + 1;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::Diagnostic*>,slang::Diagnostic*>
            (__first,__last,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->len = this->len + 1;
  this->cap = uVar5;
  this->data_ = __result;
  return (pointer)((long)__result + lVar6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}